

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

void __thiscall
TasgridWrapper::writeMatrix(TasgridWrapper *this,string *filename,int rows,int cols,double *mat)

{
  ostream *poVar1;
  double *pdVar2;
  size_t j;
  ulong uVar3;
  int i;
  long lVar4;
  ulong uVar5;
  int cols_local;
  int rows_local;
  double *local_250;
  char tsg [3];
  ofstream ofs;
  undefined8 auStack_228 [2];
  uint auStack_218 [122];
  
  if (filename->_M_string_length != 0) {
    cols_local = cols;
    rows_local = rows;
    local_250 = mat;
    std::ofstream::ofstream(&ofs);
    if (this->useASCII == true) {
      std::ofstream::open((string *)&ofs,(_Ios_Openmode)filename);
      poVar1 = (ostream *)std::ostream::operator<<(&ofs,rows);
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,cols);
      std::operator<<(poVar1,"\n");
      uVar5 = (ulong)cols;
      *(undefined8 *)((long)auStack_228 + *(long *)(_ofs + -0x18)) = 0x11;
      *(uint *)((long)auStack_218 + *(long *)(_ofs + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(_ofs + -0x18)) & 0xfffffefb | 0x100;
      pdVar2 = local_250;
      for (lVar4 = 0; lVar4 < rows; lVar4 = lVar4 + 1) {
        *(undefined8 *)((long)auStack_228 + *(long *)(_ofs + -0x18) + 8) = 0x19;
        std::ostream::_M_insert<double>(local_250[lVar4 * uVar5]);
        for (uVar3 = 1; uVar3 < uVar5; uVar3 = uVar3 + 1) {
          poVar1 = std::operator<<((ostream *)&ofs," ");
          *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0x19;
          std::ostream::_M_insert<double>(pdVar2[uVar3]);
        }
        std::operator<<((ostream *)&ofs,"\n");
        pdVar2 = pdVar2 + uVar5;
      }
    }
    else {
      std::ofstream::open((string *)&ofs,(_Ios_Openmode)filename);
      tsg[2] = 'G';
      tsg[0] = 'T';
      tsg[1] = 'S';
      std::ostream::write((char *)&ofs,(long)tsg);
      std::ostream::write((char *)&ofs,(long)&rows_local);
      std::ostream::write((char *)&ofs,(long)&cols_local);
      std::ostream::write((char *)&ofs,(long)local_250);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&ofs);
  }
  return;
}

Assistant:

void TasgridWrapper::writeMatrix(std::string const &filename, int rows, int cols, const double mat[]) const{
    if (filename.empty()) return;
    size_t cols_t = (size_t) cols;
    std::ofstream ofs;
    if (useASCII){
        Utils::Wrapper2D<const double> matrix(cols, mat);
        ofs.open(filename);
        ofs << rows << " " << cols << "\n";
        ofs.precision(17);
        ofs << std::scientific;
        for(int i=0; i<rows; i++){
            double const * r = matrix.getStrip(i);
            ofs << setw(25) << r[0];
            for(size_t j=1; j<cols_t; j++){
                ofs << " " << setw(25) << r[j];
            }
            ofs << "\n";
        }
    }else{
        ofs.open(filename, std::ios::out | std::ios::binary);
        char tsg[3] = {'T', 'S', 'G'};
        ofs.write(tsg, 3*sizeof(char));
        ofs.write((char*) &rows, sizeof(int));
        ofs.write((char*) &cols, sizeof(int));
        ofs.write((char*) mat, Utils::size_mult(rows, cols) * sizeof(double));
    }
    ofs.close();
}